

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O1

void CuAssertStrEquals_LineMsg
               (CuTest *tc,char *file,int line,char *message,char *expected,char *actual)

{
  int iVar1;
  CuString string;
  CuString local_48;
  
  if (expected != (char *)0x0 || actual != (char *)0x0) {
    if ((actual == (char *)0x0 || expected == (char *)0x0) ||
       (iVar1 = strcmp(expected,actual), iVar1 != 0)) {
      local_48.length = 0;
      local_48.size = 0x100;
      local_48.buffer = (char *)malloc(0x100);
      *local_48.buffer = '\0';
      if (message != (char *)0x0) {
        CuStringAppend(&local_48,message);
        CuStringAppend(&local_48,": ");
      }
      CuStringAppend(&local_48,"expected <");
      CuStringAppend(&local_48,expected);
      CuStringAppend(&local_48,"> but was <");
      CuStringAppend(&local_48,actual);
      CuStringAppend(&local_48,">");
      CuFailInternal(tc,file,line,&local_48);
    }
  }
  return;
}

Assistant:

void CuAssertStrEquals_LineMsg(CuTest* tc, const char* file, int line, const char* message, 
	const char* expected, const char* actual)
{
	CuString string;
	if ((expected == NULL && actual == NULL) ||
	    (expected != NULL && actual != NULL &&
	     strcmp(expected, actual) == 0))
	{
		return;
	}

	CuStringInit(&string);
	if (message != NULL) 
	{
		CuStringAppend(&string, message);
		CuStringAppend(&string, ": ");
	}
	CuStringAppend(&string, "expected <");
	CuStringAppend(&string, expected);
	CuStringAppend(&string, "> but was <");
	CuStringAppend(&string, actual);
	CuStringAppend(&string, ">");
	CuFailInternal(tc, file, line, &string);
}